

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::IdentityTessellationShaderCase::iterate
          (IdentityTessellationShaderCase *this)

{
  ObjectTraits **ppOVar1;
  CaseType CVar2;
  TestLog *pTVar3;
  char *pcVar4;
  char cVar5;
  int iVar6;
  deUint32 dVar7;
  undefined4 extraout_var;
  undefined8 extraout_RAX;
  ostream *poVar9;
  undefined4 extraout_var_00;
  ObjectTraits *traits;
  undefined8 uVar10;
  RenderTarget *pRVar11;
  TestError *pTVar12;
  long lVar13;
  char *pcVar14;
  char *pcVar15;
  void *pvVar16;
  anon_struct_64_4_50fb60c7 *paVar17;
  long lVar18;
  bool bVar19;
  undefined1 local_448 [16];
  undefined1 local_438 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_430;
  VertexArray vao;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408;
  anon_struct_64_4_50fb60c7 *local_3f8;
  Surface resultWithoutTessellation;
  Surface resultWithTessellation;
  string local_3c0;
  string local_3a0;
  undefined1 local_380 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_370;
  uint local_358;
  ContextType local_354;
  IdentityTessellationShaderCase *local_350;
  ScopedLogSection section;
  string local_340;
  string local_320;
  ProgramSources sources;
  ostringstream buf;
  ChannelType CStack_22c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220 [6];
  ios_base local_1c0 [40];
  deUint32 local_198;
  bool local_170;
  anon_struct_64_4_50fb60c7 renderTargets [2];
  long lVar8;
  
  iVar6 = (*((this->super_IdentityShaderCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar6);
  tcu::Surface::Surface(&resultWithTessellation,0x100,0x100);
  tcu::Surface::Surface(&resultWithoutTessellation,0x100,0x100);
  cVar5 = (this->m_case == CASE_TRIANGLES) + '\x02';
  renderTargets[0].name = "RenderWithTessellationShader";
  renderTargets[0].description = "Render with tessellation shader";
  renderTargets[0].containsTessellationShaders = true;
  _buf = RGBA;
  CStack_22c = UNORM_INT8;
  pvVar16 = (void *)resultWithTessellation.m_pixels.m_cap;
  if (resultWithTessellation.m_pixels.m_cap != 0) {
    pvVar16 = resultWithTessellation.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            (&renderTargets[0].surfaceAccess,(TextureFormat *)&buf,resultWithTessellation.m_width,
             resultWithTessellation.m_height,1,pvVar16);
  renderTargets[1].name = "RenderWithoutTessellationShader";
  renderTargets[1].description = "Render without tessellation shader";
  renderTargets[1].containsTessellationShaders = false;
  _buf = RGBA;
  CStack_22c = UNORM_INT8;
  pvVar16 = (void *)resultWithoutTessellation.m_pixels.m_cap;
  if (resultWithoutTessellation.m_pixels.m_cap != 0) {
    pvVar16 = resultWithoutTessellation.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            (&renderTargets[1].surfaceAccess,(TextureFormat *)&buf,resultWithoutTessellation.m_width
             ,resultWithoutTessellation.m_height,1,pvVar16);
  (**(code **)(lVar8 + 0x1a00))(0,0,0x100,0x100);
  (**(code **)(lVar8 + 0x1c0))(0,0,0,0x3f800000);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"set viewport",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x225);
  (**(code **)(lVar8 + 0x5e0))(0xbe2);
  (**(code **)(lVar8 + 0x120))(0x302,1);
  (**(code **)(lVar8 + 0x100))(0x8006);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"set blend",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x22a);
  paVar17 = renderTargets;
  uVar10 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  local_350 = this;
  do {
    local_358 = (uint)uVar10;
    pTVar3 = ((this->super_IdentityShaderCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&buf,paVar17->name,(allocator<char> *)local_448);
    local_3f8 = paVar17;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sources,paVar17->description,(allocator<char> *)&vao);
    tcu::ScopedLogSection::ScopedLogSection(&section,pTVar3,(string *)&buf,(string *)&sources);
    if (sources.sources[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)&sources.sources[0].
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(sources.sources[0].
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((sources.sources[0].
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    if (_buf != (TextureFormat)local_220) {
      operator_delete((void *)_buf,local_220[0]._M_allocated_capacity + 1);
    }
    memset(&sources,0,0xac);
    sources.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    sources.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    sources.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    sources.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    sources._193_8_ = 0;
    (anonymous_namespace)::IdentityShaderCase::getVertexSource_abi_cxx11_(&local_3c0,this);
    local_448._0_8_ = local_448._0_8_ & 0xffffffff00000000;
    local_448._8_8_ = &local_430;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_448 + 8),local_3c0._M_dataplus._M_p,
               local_3c0._M_dataplus._M_p + local_3c0._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(sources.sources + (local_448._0_8_ & 0xffffffff),(value_type *)(local_448 + 8));
    (anonymous_namespace)::IdentityShaderCase::getFragmentSource_abi_cxx11_(&local_340,this);
    ppOVar1 = &vao.super_ObjectWrapper.m_traits;
    vao.super_ObjectWrapper.m_gl = (Functions *)CONCAT44(vao.super_ObjectWrapper.m_gl._4_4_,1);
    vao.super_ObjectWrapper.m_traits = (ObjectTraits *)&local_408;
    std::__cxx11::string::_M_construct<char*>
              ((string *)ppOVar1,
               CONCAT44(local_340._M_dataplus._M_p._4_4_,(int)local_340._M_dataplus._M_p),
               local_340._M_string_length +
               CONCAT44(local_340._M_dataplus._M_p._4_4_,(int)local_340._M_dataplus._M_p));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(sources.sources + ((ulong)vao.super_ObjectWrapper.m_gl & 0xffffffff),
                (value_type *)ppOVar1);
    bVar19 = local_3f8->containsTessellationShaders;
    pcVar14 = "v_vertex_color";
    if (bVar19 != false) {
      pcVar14 = "v_evaluated_color";
    }
    CVar2 = this->m_case;
    pcVar4 = "capture_vertex_triangle_strip";
    if (CVar2 == CASE_ISOLINES) {
      pcVar4 = "capture_vertex_line_strip";
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&buf,"${VERSION_DECL}\n${EXTENSION_GEOMETRY_SHADER}layout(",0x33);
    pcVar15 = "triangles";
    if (CVar2 == CASE_ISOLINES) {
      pcVar15 = "lines";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&buf,pcVar15,(ulong)(CVar2 != CASE_ISOLINES) * 4 + 5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&buf,") in;\nlayout(",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&buf,pcVar4 + 0xf,(ulong)(CVar2 != CASE_ISOLINES) * 4 + 10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&buf,", max_vertices=",0xf);
    poVar9 = (ostream *)
             std::ostream::operator<<((ostringstream *)&buf,(uint)(CVar2 == CASE_ISOLINES) * 3 + 8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,") out;\n\nin highp vec4 ",0x16);
    lVar18 = (ulong)bVar19 * 3 + 0xe;
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar14,lVar18);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"[];\nout highp vec4 v_fragment_color;\n\nvoid main (void)\n{\n",0x39);
    if (local_350->m_case == CASE_ISOLINES) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&buf,
                 "\tvec4 mdir = vec4(gl_in[0].gl_Position.y - gl_in[1].gl_Position.y, gl_in[1].gl_Position.x - gl_in[0].gl_Position.x, 0.0, 0.0);\n\tfor (int i = 0; i <= 10; ++i)\n\t{\n\t\tfloat xweight = cos(float(i) / 10.0 * 6.28) * 0.5 + 0.5;\n\t\tfloat mweight = sin(float(i) / 10.0 * 6.28) * 0.1 + 0.1;\n\t\tgl_Position = mix(gl_in[0].gl_Position, gl_in[1].gl_Position, xweight) + mweight * mdir;\n\t\tv_fragment_color = mix("
                 ,0x18b);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&buf,pcVar14,lVar18);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&buf,"[0], ",5);
      lVar13 = 0x22;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&buf,pcVar14,lVar18);
      pcVar14 = "[1], xweight);\n\t\tEmitVertex();\n\t}\n";
LAB_0056a40c:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&buf,pcVar14,lVar13);
    }
    else if (local_350->m_case == CASE_TRIANGLES) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&buf,
                 "\tvec4 centerPos = (gl_in[0].gl_Position + gl_in[1].gl_Position + gl_in[2].gl_Position) / 3.0f;\n\n\tfor (int ndx = 0; ndx < 4; ++ndx)\n\t{\n\t\tgl_Position = centerPos + (centerPos - gl_in[ndx % 3].gl_Position);\n\t\tv_fragment_color = "
                 ,0xe1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&buf,pcVar14,lVar18);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&buf,
                 "[ndx % 3];\n\t\tEmitVertex();\n\n\t\tgl_Position = centerPos + 0.7 * (centerPos - gl_in[ndx % 3].gl_Position);\n\t\tv_fragment_color = "
                 ,0x7d);
      lVar13 = 0x1e;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&buf,pcVar14,lVar18);
      pcVar14 = "[ndx % 3];\n\t\tEmitVertex();\n\t}\n";
      goto LAB_0056a40c;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&buf,"}\n",2);
    std::__cxx11::stringbuf::str();
    this = local_350;
    local_354.super_ApiType.m_bits =
         (ApiType)(*((local_350->super_IdentityShaderCase).super_TestCase.m_context)->m_renderCtx->
                    _vptr_RenderContext[2])();
    specializeShader(&local_320,&local_3a0,&local_354);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
    std::ios_base::~ios_base(local_1c0);
    local_380._0_4_ = 2;
    local_380._8_8_ = local_370._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_380 + 8),local_320._M_dataplus._M_p,
               local_320._M_dataplus._M_p + local_320._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(sources.sources + (uint)local_380._0_4_,(value_type *)(local_380 + 8));
    if ((char *)local_380._8_8_ != local_370._M_local_buf + 8) {
      operator_delete((void *)local_380._8_8_,local_370._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)vao.super_ObjectWrapper.m_traits != &local_408) {
      operator_delete(vao.super_ObjectWrapper.m_traits,local_408._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_340._M_dataplus._M_p._4_4_,(int)local_340._M_dataplus._M_p) !=
        &local_340.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_340._M_dataplus._M_p._4_4_,(int)local_340._M_dataplus._M_p),
                      local_340.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_448._8_8_ != &local_430) {
      operator_delete((void *)local_448._8_8_,local_430._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
      operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
    }
    if (local_3f8->containsTessellationShaders == true) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&buf,
                 "${VERSION_DECL}\n${EXTENSION_TESSELATION_SHADER}layout(vertices = ",0x41);
      poVar9 = (ostream *)
               std::ostream::operator<<((ShaderProgram *)&buf,(this->m_case == CASE_TRIANGLES) + 2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,
                 ") out;\n\nin highp vec4 v_vertex_color[];\nout highp vec4 v_control_color[];\n\nvoid main (void)\n{\n\tgl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n\tv_control_color[gl_InvocationID] = v_vertex_color[gl_InvocationID];\n\n"
                 ,0xef);
      if (this->m_case == CASE_ISOLINES) {
        lVar18 = 0x3a;
        pcVar14 = "\tgl_TessLevelOuter[0] = 1.0;\n\tgl_TessLevelOuter[1] = 1.0;\n";
LAB_0056a66b:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&buf,pcVar14,lVar18);
      }
      else if (this->m_case == CASE_TRIANGLES) {
        lVar18 = 0x74;
        pcVar14 = 
        "\tgl_TessLevelOuter[0] = 1.0;\n\tgl_TessLevelOuter[1] = 1.0;\n\tgl_TessLevelOuter[2] = 1.0;\n\tgl_TessLevelInner[0] = 1.0;\n"
        ;
        goto LAB_0056a66b;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&buf,"}\n",2);
      std::__cxx11::stringbuf::str();
      local_380._0_4_ =
           (*((this->super_IdentityShaderCase).super_TestCase.m_context)->m_renderCtx->
             _vptr_RenderContext[2])();
      specializeShader(&local_3a0,(string *)&vao,(ContextType *)local_380);
      if (vao.super_ObjectWrapper.m_gl != (Functions *)&vao.super_ObjectWrapper.m_object) {
        operator_delete(vao.super_ObjectWrapper.m_gl,
                        CONCAT44(vao.super_ObjectWrapper._20_4_,vao.super_ObjectWrapper.m_object) +
                        1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
      std::ios_base::~ios_base(local_1c0);
      local_448._0_4_ = L;
      local_448._8_8_ = &local_430;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_448 + 8),local_3a0._M_dataplus._M_p,
                 local_3a0._M_dataplus._M_p + local_3a0._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(sources.sources + (local_448._0_8_ & 0xffffffff),(value_type *)(local_448 + 8));
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&buf,"${VERSION_DECL}\n${EXTENSION_TESSELATION_SHADER}layout(",0x36);
      bVar19 = this->m_case == CASE_TRIANGLES;
      pcVar14 = "isolines";
      if (bVar19) {
        pcVar14 = "triangles";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&buf,pcVar14,(ulong)bVar19 | 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&buf,
                 ") in;\n\nin highp vec4 v_control_color[];\nout highp vec4 v_evaluated_color;\n\n// note: No need to use precise gl_Position since we do not require gapless geometry\nvoid main (void)\n{\n"
                 ,0xb3);
      if (this->m_case == CASE_ISOLINES) {
        lVar18 = 0xa2;
        pcVar14 = 
        "\tgl_Position = mix(gl_in[0].gl_Position, gl_in[1].gl_Position, gl_TessCoord.x);\n\tv_evaluated_color = mix(v_control_color[0], v_control_color[1], gl_TessCoord.x);\n"
        ;
LAB_0056a7c7:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&buf,pcVar14,lVar18);
      }
      else if (this->m_case == CASE_TRIANGLES) {
        lVar18 = 0x10c;
        pcVar14 = 
        "\tgl_Position = gl_TessCoord.x * gl_in[0].gl_Position + gl_TessCoord.y * gl_in[1].gl_Position + gl_TessCoord.z * gl_in[2].gl_Position;\n\tv_evaluated_color = gl_TessCoord.x * v_control_color[0] + gl_TessCoord.y * v_control_color[1] + gl_TessCoord.z * v_control_color[2];\n"
        ;
        goto LAB_0056a7c7;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&buf,"}\n",2);
      std::__cxx11::stringbuf::str();
      local_340._M_dataplus._M_p._0_4_ =
           (*((this->super_IdentityShaderCase).super_TestCase.m_context)->m_renderCtx->
             _vptr_RenderContext[2])();
      specializeShader(&local_3c0,(string *)local_380,(ContextType *)&local_340);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_380._4_4_,local_380._0_4_) != &local_370) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_380._4_4_,local_380._0_4_),
                        local_370._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
      std::ios_base::~ios_base(local_1c0);
      vao.super_ObjectWrapper.m_gl = (Functions *)CONCAT44(vao.super_ObjectWrapper.m_gl._4_4_,4);
      vao.super_ObjectWrapper.m_traits = (ObjectTraits *)&local_408;
      ppOVar1 = &vao.super_ObjectWrapper.m_traits;
      std::__cxx11::string::_M_construct<char*>
                ((string *)ppOVar1,local_3c0._M_dataplus._M_p,
                 local_3c0._M_dataplus._M_p + local_3c0._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(sources.sources + ((ulong)vao.super_ObjectWrapper.m_gl & 0xffffffff),
                  (value_type *)ppOVar1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)vao.super_ObjectWrapper.m_traits != &local_408) {
        operator_delete(vao.super_ObjectWrapper.m_traits,local_408._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
        operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_448._8_8_ != &local_430) {
        operator_delete((void *)local_448._8_8_,local_430._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
        operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
      }
    }
    glu::ShaderProgram::ShaderProgram
              ((ShaderProgram *)&buf,
               ((this->super_IdentityShaderCase).super_TestCase.m_context)->m_renderCtx,&sources);
    iVar6 = (*((this->super_IdentityShaderCase).super_TestCase.m_context)->m_renderCtx->
              _vptr_RenderContext[3])();
    traits = glu::objectTraits(OBJECTTYPE_VERTEX_ARRAY);
    glu::ObjectWrapper::ObjectWrapper
              (&vao.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_00,iVar6),traits);
    iVar6 = (**(code **)(lVar8 + 0x780))(local_198,"a_position");
    glu::operator<<(((this->super_IdentityShaderCase).super_TestCase.super_TestCase.super_TestNode.
                    m_testCtx)->m_log,(ShaderProgram *)&buf);
    if (local_170 == false) {
      pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
      local_448._0_8_ = local_438;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_448,"could not build program","");
      tcu::TestError::TestError(pTVar12,(string *)local_448);
      __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    if (iVar6 == -1) {
      pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
      local_448._0_8_ = local_438;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_448,"a_position location was -1","");
      tcu::TestError::TestError(pTVar12,(string *)local_448);
      __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (**(code **)(lVar8 + 0xd8))(vao.super_ObjectWrapper.m_object);
    (**(code **)(lVar8 + 0x40))(0x8892,this->m_dataBuffer);
    (**(code **)(lVar8 + 0x19f0))(iVar6,4,0x1406,0,0,0);
    (**(code **)(lVar8 + 0x610))(iVar6);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"setup attribs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                    ,0x24a);
    (**(code **)(lVar8 + 0x1680))(local_198);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"use program",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                    ,0x24d);
    (**(code **)(lVar8 + 0x188))(0x4000);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"clear",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                    ,0x250);
    if (local_3f8->containsTessellationShaders == true) {
      (**(code **)(lVar8 + 0xfd8))(0x8e72,cVar5);
      dVar7 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar7,"set patch param",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                      ,0x255);
      (**(code **)(lVar8 + 0x538))(0xe,0,cVar5);
      dVar7 = (**(code **)(lVar8 + 0x800))();
      iVar6 = 600;
      pcVar14 = "draw patches";
    }
    else {
      (**(code **)(lVar8 + 0x538))((this->m_case == CASE_TRIANGLES) * '\x03' + '\x01',0,cVar5);
      dVar7 = (**(code **)(lVar8 + 0x800))();
      iVar6 = 0x25d;
      pcVar14 = "draw primitives";
    }
    glu::checkError(dVar7,pcVar14,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                    ,iVar6);
    glu::readPixels(((this->super_IdentityShaderCase).super_TestCase.m_context)->m_renderCtx,0,0,
                    &local_3f8->surfaceAccess);
    glu::ObjectWrapper::~ObjectWrapper(&vao.super_ObjectWrapper);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)&buf);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&sources.transformFeedbackVaryings);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&sources.attribLocationBindings);
    lVar18 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&sources.sources[0].
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar18));
      lVar18 = lVar18 + -0x18;
    } while (lVar18 != -0x18);
    tcu::TestLog::endSection(section.m_log);
    paVar17 = renderTargets + 1;
    uVar10 = 0;
    if ((local_358 & 1) == 0) {
      pRVar11 = Context::getRenderTarget((this->super_IdentityShaderCase).super_TestCase.m_context);
      pTVar3 = ((this->super_IdentityShaderCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx)->m_log;
      if (pRVar11->m_numSamples < 2) {
        sources.sources[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x300000008;
        if (resultWithoutTessellation.m_pixels.m_cap != 0) {
          resultWithoutTessellation.m_pixels.m_cap =
               (size_t)resultWithoutTessellation.m_pixels.m_ptr;
        }
        tcu::PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)&buf,(TextureFormat *)&sources,
                   resultWithoutTessellation.m_width,resultWithoutTessellation.m_height,1,
                   (void *)resultWithoutTessellation.m_pixels.m_cap);
        local_448._0_4_ = RGBA;
        local_448._4_4_ = UNORM_INT8;
        if (resultWithTessellation.m_pixels.m_cap != 0) {
          resultWithTessellation.m_pixels.m_cap = (size_t)resultWithTessellation.m_pixels.m_ptr;
        }
        tcu::PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)&sources,(TextureFormat *)local_448,
                   resultWithTessellation.m_width,resultWithTessellation.m_height,1,
                   (void *)resultWithTessellation.m_pixels.m_cap);
        local_448._0_4_ = RGBA;
        local_448._4_4_ = UNORM_SHORT_565;
        local_448._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0xff00000008;
        vao.super_ObjectWrapper.m_gl = (Functions *)0x100000001;
        vao.super_ObjectWrapper.m_traits =
             (ObjectTraits *)((ulong)vao.super_ObjectWrapper.m_traits & 0xffffffff00000000);
        bVar19 = tcu::intThresholdPositionDeviationCompare
                           (pTVar3,"ImageCompare","Image comparison",(ConstPixelBufferAccess *)&buf,
                            (ConstPixelBufferAccess *)&sources,(UVec4 *)local_448,(IVec3 *)&vao,true
                            ,COMPARE_LOG_RESULT);
      }
      else {
        sources.sources[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x300000008;
        if (resultWithoutTessellation.m_pixels.m_cap != 0) {
          resultWithoutTessellation.m_pixels.m_cap =
               (size_t)resultWithoutTessellation.m_pixels.m_ptr;
        }
        tcu::PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)&buf,(TextureFormat *)&sources,
                   resultWithoutTessellation.m_width,resultWithoutTessellation.m_height,1,
                   (void *)resultWithoutTessellation.m_pixels.m_cap);
        local_448._0_4_ = RGBA;
        local_448._4_4_ = UNORM_INT8;
        if (resultWithTessellation.m_pixels.m_cap != 0) {
          resultWithTessellation.m_pixels.m_cap = (size_t)resultWithTessellation.m_pixels.m_ptr;
        }
        tcu::PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)&sources,(TextureFormat *)local_448,
                   resultWithTessellation.m_width,resultWithTessellation.m_height,1,
                   (void *)resultWithTessellation.m_pixels.m_cap);
        bVar19 = tcu::fuzzyCompare(pTVar3,"ImageCompare","Image comparison",
                                   (ConstPixelBufferAccess *)&buf,(ConstPixelBufferAccess *)&sources
                                   ,0.03,COMPARE_LOG_RESULT);
      }
      if (bVar19 == false) {
        pcVar14 = "Image comparison failed";
      }
      else {
        pcVar14 = "Pass";
      }
      tcu::TestContext::setTestResult
                ((this->super_IdentityShaderCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,(uint)(bVar19 == false),pcVar14);
      tcu::Surface::~Surface(&resultWithoutTessellation);
      tcu::Surface::~Surface(&resultWithTessellation);
      return STOP;
    }
  } while( true );
}

Assistant:

IdentityTessellationShaderCase::IterateResult IdentityTessellationShaderCase::iterate (void)
{
	const glw::Functions&	gl							= m_context.getRenderContext().getFunctions();
	tcu::Surface			resultWithTessellation		(RENDER_SIZE, RENDER_SIZE);
	tcu::Surface			resultWithoutTessellation	(RENDER_SIZE, RENDER_SIZE);
	const int				numPrimitiveVertices		= (m_case == CASE_TRIANGLES) ? (3) : (2);

	const struct
	{
		const char*				name;
		const char*				description;
		bool					containsTessellationShaders;
		tcu::PixelBufferAccess	surfaceAccess;
	} renderTargets[] =
	{
		{ "RenderWithTessellationShader",		"Render with tessellation shader",		true,	resultWithTessellation.getAccess()		},
		{ "RenderWithoutTessellationShader",	"Render without tessellation shader",	false,	resultWithoutTessellation.getAccess()	},
	};

	gl.viewport(0, 0, RENDER_SIZE, RENDER_SIZE);
	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	GLU_EXPECT_NO_ERROR(gl.getError(), "set viewport");

	gl.enable(GL_BLEND);
	gl.blendFunc(GL_SRC_ALPHA, GL_ONE);
	gl.blendEquation(GL_FUNC_ADD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "set blend");

	// render with and without tessellation shader
	for (int renderNdx = 0; renderNdx < DE_LENGTH_OF_ARRAY(renderTargets); ++renderNdx)
	{
		const tcu::ScopedLogSection	section	(m_testCtx.getLog(), renderTargets[renderNdx].name, renderTargets[renderNdx].description);
		glu::ProgramSources			sources;

		sources	<< glu::VertexSource(getVertexSource())
				<< glu::FragmentSource(getFragmentSource())
				<< glu::GeometrySource(getGeometrySource(renderTargets[renderNdx].containsTessellationShaders));

		if (renderTargets[renderNdx].containsTessellationShaders)
			sources	<< glu::TessellationControlSource(getTessellationControlSource())
					<< glu::TessellationEvaluationSource(getTessellationEvaluationSource());

		{
			const glu::ShaderProgram	program					(m_context.getRenderContext(), sources);
			const glu::VertexArray		vao						(m_context.getRenderContext());
			const int					posLocation				= gl.getAttribLocation(program.getProgram(), "a_position");

			m_testCtx.getLog() << program;

			if (!program.isOk())
				throw tcu::TestError("could not build program");
			if (posLocation == -1)
				throw tcu::TestError("a_position location was -1");

			gl.bindVertexArray(*vao);
			gl.bindBuffer(GL_ARRAY_BUFFER, m_dataBuffer);
			gl.vertexAttribPointer(posLocation, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
			gl.enableVertexAttribArray(posLocation);
			GLU_EXPECT_NO_ERROR(gl.getError(), "setup attribs");

			gl.useProgram(program.getProgram());
			GLU_EXPECT_NO_ERROR(gl.getError(), "use program");

			gl.clear(GL_COLOR_BUFFER_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "clear");

			if (renderTargets[renderNdx].containsTessellationShaders)
			{
				gl.patchParameteri(GL_PATCH_VERTICES, numPrimitiveVertices);
				GLU_EXPECT_NO_ERROR(gl.getError(), "set patch param");

				gl.drawArrays(GL_PATCHES, 0, numPrimitiveVertices);
				GLU_EXPECT_NO_ERROR(gl.getError(), "draw patches");
			}
			else
			{
				gl.drawArrays((m_case == CASE_TRIANGLES) ? (GL_TRIANGLES) : (GL_LINES), 0, numPrimitiveVertices);
				GLU_EXPECT_NO_ERROR(gl.getError(), "draw primitives");
			}

			glu::readPixels(m_context.getRenderContext(), 0, 0, renderTargets[renderNdx].surfaceAccess);
		}
	}

	// compare
	{
		bool imageOk;

		if (m_context.getRenderTarget().getNumSamples() > 1)
			imageOk = tcu::fuzzyCompare(m_testCtx.getLog(),
										"ImageCompare",
										"Image comparison",
										resultWithoutTessellation.getAccess(),
										resultWithTessellation.getAccess(),
										0.03f,
										tcu::COMPARE_LOG_RESULT);
		else
			imageOk = tcu::intThresholdPositionDeviationCompare(m_testCtx.getLog(),
																"ImageCompare",
																"Image comparison",
																resultWithoutTessellation.getAccess(),
																resultWithTessellation.getAccess(),
																tcu::UVec4(8, 8, 8, 255),				//!< threshold
																tcu::IVec3(1, 1, 0),					//!< 3x3 search kernel
																true,									//!< fragments may end up over the viewport, just ignore them
																tcu::COMPARE_LOG_RESULT);

		if (imageOk)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
	}

	return STOP;
}